

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# measure.cpp
# Opt level: O2

UBool __thiscall icu_63::Measure::operator==(Measure *this,UObject *other)

{
  MeasureUnit *pMVar1;
  bool bVar2;
  UBool UVar3;
  int iVar4;
  
  if (this == (Measure *)other) {
    return '\x01';
  }
  bVar2 = std::type_info::operator!=
                    ((type_info *)(this->super_UObject)._vptr_UObject[-1],
                     (type_info *)other->_vptr_UObject[-1]);
  if ((!bVar2) &&
     (UVar3 = Formattable::operator==(&this->number,(Formattable *)(other + 1)), UVar3 != '\0')) {
    pMVar1 = this->unit;
    bVar2 = other[0xf]._vptr_UObject == (_func_int **)0x0;
    if (pMVar1 == (MeasureUnit *)0x0 || bVar2) {
      return (pMVar1 == (MeasureUnit *)0x0) == bVar2;
    }
    iVar4 = (*(pMVar1->super_UObject)._vptr_UObject[4])();
    return (char)iVar4 != '\0';
  }
  return '\0';
}

Assistant:

UBool Measure::operator==(const UObject& other) const {
    if (this == &other) {  // Same object, equal
        return TRUE;
    }
    if (typeid(*this) != typeid(other)) { // Different types, not equal
        return FALSE;
    }
    const Measure &m = static_cast<const Measure&>(other);
    return number == m.number &&
        ((unit == NULL) == (m.unit == NULL)) &&
        (unit == NULL || *unit == *m.unit);
}